

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::AtomNameVisitor::AtomNameVisitor(AtomNameVisitor *this,SimInfo *info)

{
  ForceField *pFVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x34555d);
  *in_RDI = &PTR__AtomNameVisitor_00485ef8;
  in_RDI[5] = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"AtomNameVisitor");
  pFVar1 = SimInfo::getForceField((SimInfo *)in_RDI[5]);
  in_RDI[6] = pFVar1;
  return;
}

Assistant:

AtomNameVisitor::AtomNameVisitor(SimInfo* info) : BaseVisitor(), info_(info) {
    visitorName = "AtomNameVisitor";
    ff_         = info_->getForceField();
  }